

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# construct2.cpp
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_> boundary;
  graph lat;
  span_t span;
  basis_t bs;
  basis basis;
  unitcell unitcell;
  vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_> local_118;
  graph local_f8;
  DenseStorage<long,__1,__1,__1,_0> local_a8;
  DenseStorage<double,__1,__1,__1,_0> local_88;
  basis local_68;
  unitcell local_50;
  
  local_88.m_data = (double *)0x0;
  local_88.m_rows = 0;
  local_88.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_88,1,1,1);
  *local_88.m_data = 1.0;
  lattice::basis::basis(&local_68,(basis_t *)&local_88);
  local_50.dim_ = 1;
  local_50.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.dim_ = 0;
  local_f8.sites_.
  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  free((void *)0x0);
  puVar1 = (undefined8 *)malloc(8);
  if (puVar1 == (undefined8 *)0x0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = operator_new;
    __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_f8.sites_.
  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  *puVar1 = 0;
  local_f8.dim_ = (size_t)puVar1;
  lattice::unitcell::add_site(&local_50,(coordinate_t *)&local_f8,0);
  free((void *)local_f8.dim_);
  local_f8.dim_ = 0;
  local_f8.sites_.
  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  free((void *)0x0);
  puVar1 = (undefined8 *)malloc(8);
  if (puVar1 != (undefined8 *)0x0) {
    local_f8.sites_.
    super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x1;
    *puVar1 = 1;
    local_f8.dim_ = (size_t)puVar1;
    lattice::unitcell::add_bond(&local_50,0,0,(offset_t *)&local_f8,0);
    free((void *)local_f8.dim_);
    local_a8.m_data = (long *)0x0;
    local_a8.m_rows = 0;
    local_a8.m_cols = 0;
    Eigen::DenseStorage<long,_-1,_-1,_-1,_0>::resize(&local_a8,1,1,1);
    *local_a8.m_data = 0x10;
    local_118.super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118.super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(4);
    local_118.super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_118.super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>.
         _M_impl.super__Vector_impl_data._M_start + 1;
    *local_118.super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>._M_impl
     .super__Vector_impl_data._M_start = periodic;
    local_118.super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_118.super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    lattice::graph::graph(&local_f8,&local_68,&local_50,(span_t *)&local_a8,&local_118);
    lattice::graph::print(&local_f8,(ostream *)&std::cout);
    if (local_f8.bonds_.
        super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.bonds_.
                      super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_f8.bonds_.
                            super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.bonds_.
                            super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::~vector(&local_f8.coordinates_);
    std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::~vector
              (&local_f8.sites_);
    if (local_118.super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.
                      super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_118.
                            super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.
                            super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    free(local_a8.m_data);
    std::vector<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>::~vector
              (&local_50.bonds_);
    std::vector<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>::~vector
              (&local_50.sites_);
    free(local_68.basis_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data);
    free(local_88.m_data);
    return 0;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = operator_new;
  __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

int main() {
  lattice::basis_t bs(1, 1); bs << 1; // 1x1 matrix
  lattice::basis basis(bs);
  lattice::unitcell unitcell(1);
  unitcell.add_site(lattice::coordinate(0), 0);
  unitcell.add_bond(0, 0, lattice::offset(1), 0);
  lattice::span_t span(1, 1); span << 16; // 1x1 matrix
  std::vector<lattice::boundary_t> boundary(1, lattice::boundary_t::periodic);
  lattice::graph lat(basis, unitcell, span, boundary);
  lat.print(std::cout);
}